

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableGet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableGet *curr)

{
  undefined8 uVar1;
  undefined1 local_a0 [8];
  Flow index;
  TableInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_a0,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->index);
  if (index.breakTo.super_IString.str._M_len == 0) {
    getTableInstanceInfo
              ((TableInstanceInfo *)&index.breakTo.super_IString.str._M_str,this,
               (Name)(curr->table).super_IString.str);
    Flow::getSingleValue((Flow *)local_a0);
    uVar1 = ::wasm::Literal::getUnsigned();
    (**(code **)(**(long **)(index.breakTo.super_IString.str._M_str + 0x200) + 0xe8))
              (&info.name.super_IString.str._M_str,
               *(long **)(index.breakTo.super_IString.str._M_str + 0x200),info.instance,
               info.name.super_IString.str._M_len,uVar1);
    Flow::Flow(__return_storage_ptr__,(Literal *)&info.name.super_IString.str._M_str);
    ::wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_a0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableGet(TableGet* curr) {
    NOTE_ENTER("TableGet");
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    auto info = getTableInstanceInfo(curr->table);
    auto address = index.getSingleValue().getUnsigned();
    return info.interface()->tableLoad(info.name, address);
  }